

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

void __thiscall tinyxml2::XMLPrinter::PushUnknown(XMLPrinter *this,char *value)

{
  SealElementIfJustOpened(this);
  if (((this->_textDepth < 0) && (this->_firstElement == false)) && (this->_compactMode == false)) {
    Print(this,"\n");
    (*(this->super_XMLVisitor)._vptr_XMLVisitor[0xc])(this,(ulong)(uint)this->_depth);
  }
  this->_firstElement = false;
  Print(this,"<!%s>",value);
  return;
}

Assistant:

void XMLPrinter::PushUnknown( const char* value )
{
    SealElementIfJustOpened();
    if ( _textDepth < 0 && !_firstElement && !_compactMode) {
        Print( "\n" );
        PrintSpace( _depth );
    }
    _firstElement = false;
    Print( "<!%s>", value );
}